

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

void __thiscall
slang::ast::SequenceConcatExpr::serializeTo(SequenceConcatExpr *this,ASTSerializer *serializer)

{
  size_t sVar1;
  long lVar2;
  Element *elem;
  pointer this_00;
  string_view name;
  
  name._M_str = "elements";
  name._M_len = 8;
  ASTSerializer::startArray(serializer,name);
  sVar1 = (this->elements)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    this_00 = (this->elements)._M_ptr;
    lVar2 = sVar1 * 0x28;
    do {
      ASTSerializer::startObject(serializer);
      ASTSerializer::write(serializer,8,"sequence",(size_t)(this_00->sequence).ptr);
      SequenceRange::serializeTo(&this_00->delay,serializer);
      ASTSerializer::endObject(serializer);
      this_00 = this_00 + 1;
      lVar2 = lVar2 + -0x28;
    } while (lVar2 != 0);
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void SequenceConcatExpr::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("elements");

    for (auto& elem : elements) {
        serializer.startObject();
        serializer.write("sequence", *elem.sequence);
        elem.delay.serializeTo(serializer);
        serializer.endObject();
    }

    serializer.endArray();
}